

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

void __thiscall icu_63::DateFormatSymbols::initZoneStringsArray(DateFormatSymbols *this)

{
  uint uVar1;
  int iVar2;
  StringEnumeration *pSVar3;
  UnicodeString **__s;
  undefined4 extraout_var;
  undefined8 *puVar5;
  long lVar6;
  UDate UVar7;
  UErrorCode *status_00;
  UDate UVar8;
  ulong uVar9;
  UErrorCode status;
  UnicodeString tzDispName;
  UErrorCode local_94;
  UDate local_90;
  UDate local_88;
  TimeZoneNames *local_80;
  StringEnumeration *local_78;
  UnicodeString local_70;
  UnicodeString *pUVar4;
  
  if (this->fZoneStrings != (UnicodeString **)0x0) {
    return;
  }
  if (this->fLocaleZoneStrings != (UnicodeString **)0x0) {
    return;
  }
  local_94 = U_ZERO_ERROR;
  __s = (UnicodeString **)0x0;
  pSVar3 = TimeZone::createTimeZoneIDEnumeration
                     (UCAL_ZONE_TYPE_ANY,(char *)0x0,(int32_t *)0x0,&local_94);
  uVar1 = (*(pSVar3->super_UObject)._vptr_UObject[4])(pSVar3);
  UVar8 = (UDate)(ulong)uVar1;
  if (U_ZERO_ERROR < local_94) goto LAB_002e236a;
  __s = (UnicodeString **)uprv_malloc_63((long)(int)(uVar1 * 8));
  if (__s == (UnicodeString **)0x0) {
    local_94 = U_MEMORY_ALLOCATION_ERROR;
    __s = (UnicodeString **)0x0;
    goto LAB_002e236a;
  }
  local_78 = pSVar3;
  memset(__s,0,(long)(int)(uVar1 * 8));
  status_00 = &local_94;
  local_80 = TimeZoneNames::createInstance(&this->fZSFLocale,status_00);
  (*(local_80->super_UObject)._vptr_UObject[0xd])();
  if (local_94 < U_ILLEGAL_ARGUMENT_ERROR) {
    local_90 = Calendar::getNow();
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    uVar9 = 0;
    while( true ) {
      status_00 = &local_94;
      iVar2 = (*(local_78->super_UObject)._vptr_UObject[7])();
      pUVar4 = (UnicodeString *)CONCAT44(extraout_var,iVar2);
      if ((pUVar4 == (UnicodeString *)0x0) || (U_ZERO_ERROR < local_94)) goto LAB_002e22da;
      puVar5 = (undefined8 *)UMemory::operator_new__((UMemory *)0x148,(size_t)status_00);
      if (puVar5 == (undefined8 *)0x0) break;
      *puVar5 = 5;
      lVar6 = 0x10;
      do {
        *(undefined ***)((long)puVar5 + lVar6 + -8) = &PTR__UnicodeString_00487e70;
        *(undefined2 *)((long)puVar5 + lVar6) = 2;
        lVar6 = lVar6 + 0x40;
      } while (lVar6 != 0x150);
      __s[uVar9] = (UnicodeString *)(puVar5 + 1);
      icu_63::UnicodeString::copyFrom((UnicodeString *)(puVar5 + 1),pUVar4,'\0');
      (*(local_80->super_UObject)._vptr_UObject[0xe])
                (local_90,local_80,pUVar4,initZoneStringsArray::TYPES,4,__s[uVar9] + 1,&local_94);
      uVar9 = uVar9 + 1;
    }
    __s[uVar9 & 0xffffffff] = (UnicodeString *)0x0;
    local_94 = U_MEMORY_ALLOCATION_ERROR;
LAB_002e22da:
    icu_63::UnicodeString::~UnicodeString(&local_70);
    if (U_ZERO_ERROR < local_94) goto LAB_002e22ee;
  }
  else {
LAB_002e22ee:
    local_88 = UVar8;
    if (0 < (int)uVar1) {
      UVar7 = 0.0;
      local_90 = UVar8;
      do {
        pUVar4 = __s[(long)UVar7];
        if (pUVar4 != (UnicodeString *)0x0) {
          lVar6 = *(long *)((long)&pUVar4[-1].fUnion + 0x30);
          if (lVar6 != 0) {
            lVar6 = lVar6 << 6;
            do {
              icu_63::UnicodeString::~UnicodeString
                        ((UnicodeString *)
                         ((long)&pUVar4[-1].super_Replaceable.super_UObject._vptr_UObject + lVar6));
              lVar6 = lVar6 + -0x40;
            } while (lVar6 != 0);
          }
          UMemory::operator_delete__((UMemory *)((long)&pUVar4[-1].fUnion + 0x30),status_00);
        }
        UVar7 = (UDate)((long)UVar7 + 1);
      } while (UVar7 != local_90);
    }
    uprv_free_63(__s);
    __s = (UnicodeString **)0x0;
    uVar1 = SUB84(local_88,0);
  }
  (*(local_80->super_UObject)._vptr_UObject[1])();
  pSVar3 = local_78;
LAB_002e236a:
  (*(pSVar3->super_UObject)._vptr_UObject[1])(pSVar3);
  this->fLocaleZoneStrings = __s;
  this->fZoneStringsRowCount = uVar1;
  this->fZoneStringsColCount = 5;
  return;
}

Assistant:

void
DateFormatSymbols::initZoneStringsArray(void) {
    if (fZoneStrings != NULL || fLocaleZoneStrings != NULL) {
        return;
    }

    UErrorCode status = U_ZERO_ERROR;

    StringEnumeration *tzids = NULL;
    UnicodeString ** zarray = NULL;
    TimeZoneNames *tzNames = NULL;
    int32_t rows = 0;

    static const UTimeZoneNameType TYPES[] = {
        UTZNM_LONG_STANDARD, UTZNM_SHORT_STANDARD,
        UTZNM_LONG_DAYLIGHT, UTZNM_SHORT_DAYLIGHT
    };
    static const int32_t NUM_TYPES = 4;

    do { // dummy do-while

        tzids = TimeZone::createTimeZoneIDEnumeration(ZONE_SET, NULL, NULL, status);
        rows = tzids->count(status);
        if (U_FAILURE(status)) {
            break;
        }

        // Allocate array
        int32_t size = rows * sizeof(UnicodeString*);
        zarray = (UnicodeString**)uprv_malloc(size);
        if (zarray == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            break;
        }
        uprv_memset(zarray, 0, size);

        tzNames = TimeZoneNames::createInstance(fZSFLocale, status);
        tzNames->loadAllDisplayNames(status);
        if (U_FAILURE(status)) { break; }

        const UnicodeString *tzid;
        int32_t i = 0;
        UDate now = Calendar::getNow();
        UnicodeString tzDispName;

        while ((tzid = tzids->snext(status)) != 0) {
            if (U_FAILURE(status)) {
                break;
            }

            zarray[i] = new UnicodeString[5];
            if (zarray[i] == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }

            zarray[i][0].setTo(*tzid);
            tzNames->getDisplayNames(*tzid, TYPES, NUM_TYPES, now, zarray[i]+1, status);
            i++;
        }

    } while (FALSE);

    if (U_FAILURE(status)) {
        if (zarray) {
            for (int32_t i = 0; i < rows; i++) {
                if (zarray[i]) {
                    delete[] zarray[i];
                }
            }
            uprv_free(zarray);
            zarray = NULL;
        }
    }

    if (tzNames) {
        delete tzNames;
    }
    if (tzids) {
        delete tzids;
    }

    fLocaleZoneStrings = zarray;
    fZoneStringsRowCount = rows;
    fZoneStringsColCount = 1 + NUM_TYPES;
}